

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFEmbeddedFileDocumentHelper.cc
# Opt level: O0

void __thiscall
QPDFEmbeddedFileDocumentHelper::initEmbeddedFiles(QPDFEmbeddedFileDocumentHelper *this)

{
  bool bVar1;
  element_type *this_00;
  undefined1 local_168 [40];
  string local_140;
  undefined1 local_120 [8];
  QPDFNameTreeObjectHelper nth;
  string local_e0 [32];
  undefined1 local_c0 [8];
  QPDFObjectHandle embedded_files;
  allocator<char> local_99;
  QPDFObjectHandle local_98 [2];
  QPDFObjectHandle local_78 [2];
  allocator<char> local_51;
  string local_50 [32];
  undefined1 local_30 [8];
  QPDFObjectHandle names;
  QPDFObjectHandle root;
  QPDFEmbeddedFileDocumentHelper *this_local;
  
  bVar1 = hasEmbeddedFiles(this);
  if (!bVar1) {
    QPDF::getRoot((QPDF *)&names.super_BaseHandle.obj.
                           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_50,"/Names",&local_51);
    QPDFObjectHandle::getKey
              ((QPDFObjectHandle *)local_30,
               (string *)
               &names.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::__cxx11::string::~string(local_50);
    std::allocator<char>::~allocator(&local_51);
    bVar1 = QPDFObjectHandle::isDictionary((QPDFObjectHandle *)local_30);
    if (!bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)local_98,"/Names",&local_99);
      QPDFObjectHandle::newDictionary();
      QPDFObjectHandle::replaceKeyAndGetNew
                (local_78,(string *)
                          &names.super_BaseHandle.obj.
                           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                 local_98);
      QPDFObjectHandle::operator=((QPDFObjectHandle *)local_30,local_78);
      QPDFObjectHandle::~QPDFObjectHandle(local_78);
      QPDFObjectHandle::~QPDFObjectHandle
                ((QPDFObjectHandle *)
                 &embedded_files.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::__cxx11::string::~string((string *)local_98);
      std::allocator<char>::~allocator(&local_99);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_e0,"/EmbeddedFiles",
               (allocator<char> *)
               ((long)&nth.m.
                       super___shared_ptr<QPDFNameTreeObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi + 7));
    QPDFObjectHandle::getKey((QPDFObjectHandle *)local_c0,(string *)local_30);
    std::__cxx11::string::~string(local_e0);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&nth.m.
                       super___shared_ptr<QPDFNameTreeObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi + 7));
    bVar1 = QPDFObjectHandle::isDictionary((QPDFObjectHandle *)local_c0);
    if (!bVar1) {
      QPDFNameTreeObjectHelper::newEmpty
                ((QPDFNameTreeObjectHelper *)local_120,(this->super_QPDFDocumentHelper).qpdf,true);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_140,"/EmbeddedFiles",(allocator<char> *)(local_168 + 0x27));
      QPDFObjectHelper::getObjectHandle((QPDFObjectHelper *)(local_168 + 0x10));
      QPDFObjectHandle::replaceKey
                ((QPDFObjectHandle *)local_30,&local_140,(QPDFObjectHandle *)(local_168 + 0x10));
      QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)(local_168 + 0x10));
      std::__cxx11::string::~string((string *)&local_140);
      std::allocator<char>::~allocator((allocator<char> *)(local_168 + 0x27));
      std::make_shared<QPDFNameTreeObjectHelper,QPDFNameTreeObjectHelper&>
                ((QPDFNameTreeObjectHelper *)local_168);
      this_00 = std::
                __shared_ptr_access<QPDFEmbeddedFileDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<QPDFEmbeddedFileDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&this->m);
      std::shared_ptr<QPDFNameTreeObjectHelper>::operator=
                (&this_00->embedded_files,(shared_ptr<QPDFNameTreeObjectHelper> *)local_168);
      std::shared_ptr<QPDFNameTreeObjectHelper>::~shared_ptr
                ((shared_ptr<QPDFNameTreeObjectHelper> *)local_168);
      QPDFNameTreeObjectHelper::~QPDFNameTreeObjectHelper((QPDFNameTreeObjectHelper *)local_120);
    }
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_c0);
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_30);
    QPDFObjectHandle::~QPDFObjectHandle
              ((QPDFObjectHandle *)
               &names.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  return;
}

Assistant:

void
QPDFEmbeddedFileDocumentHelper::initEmbeddedFiles()
{
    if (hasEmbeddedFiles()) {
        return;
    }
    auto root = qpdf.getRoot();
    auto names = root.getKey("/Names");
    if (!names.isDictionary()) {
        names = root.replaceKeyAndGetNew("/Names", QPDFObjectHandle::newDictionary());
    }
    auto embedded_files = names.getKey("/EmbeddedFiles");
    if (!embedded_files.isDictionary()) {
        auto nth = QPDFNameTreeObjectHelper::newEmpty(this->qpdf);
        names.replaceKey("/EmbeddedFiles", nth.getObjectHandle());
        m->embedded_files = std::make_shared<QPDFNameTreeObjectHelper>(nth);
    }
}